

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkQueue.c
# Opt level: O2

_Bool queueDone(queue *q)

{
  _Bool _Var1;
  chunk *chunk;
  
  chunk = createChunk();
  chunk->action = '\x05';
  _Var1 = enque(chunk,q);
  return _Var1;
}

Assistant:

inline bool queueDone(queue* q)
{
    chunk* done = createChunk();
    done->action = DONE;

    if (enque(done, q)) { return true; }
  
    pdebug("!!!!!queueDone Failed!!!!!");
    return false;
}